

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O2

void png_warning(png_const_structrp png_ptr,png_const_charp warning_message)

{
  uint uVar1;
  ulong uVar3;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = 0;
  if (png_ptr != (png_const_structrp)0x0) {
    if (*warning_message == '#') {
      uVar2 = 0xf;
      for (uVar3 = 1; uVar3 != 0xf; uVar3 = uVar3 + 1) {
        if (warning_message[uVar3] == ' ') {
          uVar2 = uVar3 & 0xffffffff;
          break;
        }
      }
    }
    uVar1 = (uint)uVar2;
    if (png_ptr->warning_fn != (png_error_ptr)0x0) {
      (*png_ptr->warning_fn)(png_ptr,warning_message + uVar2);
      return;
    }
  }
  fprintf(_stderr,"libpng warning: %s",warning_message + uVar1);
  fputc(10,_stderr);
  return;
}

Assistant:

void PNGAPI
png_warning(png_const_structrp png_ptr, png_const_charp warning_message)
{
   int offset = 0;
   if (png_ptr != NULL)
   {
#ifdef PNG_ERROR_NUMBERS_SUPPORTED
   if ((png_ptr->flags &
       (PNG_FLAG_STRIP_ERROR_NUMBERS|PNG_FLAG_STRIP_ERROR_TEXT)) != 0)
#endif
      {
         if (*warning_message == PNG_LITERAL_SHARP)
         {
            for (offset = 1; offset < 15; offset++)
               if (warning_message[offset] == ' ')
                  break;
         }
      }
   }
   if (png_ptr != NULL && png_ptr->warning_fn != NULL)
      (*(png_ptr->warning_fn))(png_constcast(png_structrp,png_ptr),
          warning_message + offset);
   else
      png_default_warning(png_ptr, warning_message + offset);
}